

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

int main(void)

{
  Session *pSVar1;
  atomic<unsigned_long> aVar2;
  SessionWriter *pSVar3;
  __atomic_base<unsigned_long> _Var4;
  nanoseconds nVar5;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *out;
  allocator local_555;
  allocator local_554;
  allocator local_553;
  allocator local_552;
  allocator local_551;
  ConsumeResult local_550;
  undefined1 local_530 [48];
  string local_500 [32];
  string local_4e0 [32];
  uint64_t local_4c0;
  string local_4b8 [32];
  string local_498 [32];
  undefined1 local_478 [48];
  string local_448 [32];
  string local_428 [32];
  uint64_t local_408;
  string local_400 [32];
  string local_3e0 [32];
  undefined1 local_3c0 [48];
  string local_390 [32];
  string local_370 [32];
  uint64_t local_350;
  string local_348 [32];
  string local_328 [32];
  undefined1 local_308 [48];
  string local_2d8 [32];
  string local_2b8 [32];
  uint64_t local_298;
  string local_290 [32];
  string local_270 [32];
  undefined1 local_250 [48];
  string local_220 [32];
  string local_200 [32];
  uint64_t local_1e0;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 local_198 [48];
  string local_168 [32];
  string local_148 [32];
  uint64_t local_128;
  string local_120 [32];
  string local_100 [32];
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  uint64_t local_70;
  string local_68 [32];
  string local_48 [32];
  
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x21) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_e0._0_8_ = 0;
      local_e0._8_2_ = trace;
      std::__cxx11::string::string((string *)(local_e0 + 0x10),"main",(allocator *)&local_550);
      std::__cxx11::string::string(local_b0,"main",&local_551);
      std::__cxx11::string::string
                (local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_552);
      local_70 = 7;
      std::__cxx11::string::string(local_68,"Hello",&local_553);
      local_554 = (allocator)0x0;
      std::__cxx11::string::string(local_48,(char *)&local_554,&local_555);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_e0);
      binlog::EventSource::~EventSource((EventSource *)local_e0);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x41) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_198._0_8_ = 0;
      local_198._8_2_ = debug;
      std::__cxx11::string::string((string *)(local_198 + 0x10),"main",(allocator *)&local_550);
      std::__cxx11::string::string(local_168,"main",&local_551);
      std::__cxx11::string::string
                (local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_552);
      local_128 = 9;
      std::__cxx11::string::string(local_120,"Hello",&local_553);
      local_554 = (allocator)0x0;
      std::__cxx11::string::string(local_100,(char *)&local_554,&local_555);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_198);
      binlog::EventSource::~EventSource((EventSource *)local_198);
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_250._0_8_ = 0;
      local_250._8_2_ = info;
      std::__cxx11::string::string((string *)(local_250 + 0x10),"main",(allocator *)&local_550);
      std::__cxx11::string::string(local_220,"main",&local_551);
      std::__cxx11::string::string
                (local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_552);
      local_1e0 = 0xb;
      std::__cxx11::string::string(local_1d8,"Hello",&local_553);
      local_554 = (allocator)0x0;
      std::__cxx11::string::string(local_1b8,(char *)&local_554,&local_555);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_250);
      binlog::EventSource::~EventSource((EventSource *)local_250);
      LOCK();
      UNLOCK();
      main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x101) {
    if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_308._0_8_ = 0;
      local_308._8_2_ = warning;
      std::__cxx11::string::string((string *)(local_308 + 0x10),"main",(allocator *)&local_550);
      std::__cxx11::string::string(local_2d8,"main",&local_551);
      std::__cxx11::string::string
                (local_2b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_552);
      local_298 = 0xd;
      std::__cxx11::string::string(local_290,"Hello",&local_553);
      local_554 = (allocator)0x0;
      std::__cxx11::string::string(local_270,(char *)&local_554,&local_555);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_308);
      binlog::EventSource::~EventSource((EventSource *)local_308);
      LOCK();
      UNLOCK();
      main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x201) {
    if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_3c0._0_8_ = 0;
      local_3c0._8_2_ = error;
      std::__cxx11::string::string((string *)(local_3c0 + 0x10),"main",(allocator *)&local_550);
      std::__cxx11::string::string(local_390,"main",&local_551);
      std::__cxx11::string::string
                (local_370,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_552);
      local_350 = 0xf;
      std::__cxx11::string::string(local_348,"Hello",&local_553);
      local_554 = (allocator)0x0;
      std::__cxx11::string::string(local_328,(char *)&local_554,&local_555);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_3c0);
      binlog::EventSource::~EventSource((EventSource *)local_3c0);
      LOCK();
      UNLOCK();
      main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x401) {
    if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_478._0_8_ = 0;
      local_478._8_2_ = critical;
      std::__cxx11::string::string((string *)(local_478 + 0x10),"main",(allocator *)&local_550);
      std::__cxx11::string::string(local_448,"main",&local_551);
      std::__cxx11::string::string
                (local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_552);
      local_408 = 0x11;
      std::__cxx11::string::string(local_400,"Hello",&local_553);
      local_554 = (allocator)0x0;
      std::__cxx11::string::string(local_3e0,(char *)&local_554,&local_555);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_478);
      binlog::EventSource::~EventSource((EventSource *)local_478);
      LOCK();
      UNLOCK();
      main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r);
  }
  pSVar3 = binlog::default_thread_local_writer();
  out = extraout_RDX;
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_530._0_8_ = 0;
      local_530._8_2_ = info;
      std::__cxx11::string::string((string *)(local_530 + 0x10),"main",&local_551);
      std::__cxx11::string::string(local_500,"main",&local_552);
      std::__cxx11::string::string
                (local_4e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_553);
      local_4c0 = 0x15;
      std::__cxx11::string::string(local_4b8,"Result: {}",&local_554);
      local_550.bytesConsumed._0_4_ = CONCAT22(local_550.bytesConsumed._2_2_,0x69);
      std::__cxx11::string::string(local_498,(char *)&local_550,&local_555);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_530);
      binlog::EventSource::~EventSource((EventSource *)local_530);
      LOCK();
      UNLOCK();
      main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    local_550.bytesConsumed._0_4_ = 0x2a;
    binlog::SessionWriter::addEvent<int>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (int *)&local_550);
    out = extraout_RDX_00;
  }
  binlog::consume<std::ostream>(&local_550,(binlog *)&std::cout,out);
  return 0;
}

Assistant:

int main()
{
  BINLOG_TRACE("Hello");
  // Outputs: TRAC Hello
  BINLOG_DEBUG("Hello");
  // Outputs: DEBG Hello
  BINLOG_INFO("Hello");
  // Outputs: INFO Hello
  BINLOG_WARN("Hello");
  // Outputs: WARN Hello
  BINLOG_ERROR("Hello");
  // Outputs: ERRO Hello
  BINLOG_CRITICAL("Hello");
  // Outputs: CRIT Hello

  //[log
  BINLOG_INFO("Result: {}", 42);
  // Outputs: INFO Result: 42
  //]

  binlog::consume(std::cout);
  return 0;
}